

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::UnpackUnorm4x8CaseInstance::iterate
          (TestStatus *__return_storage_ptr__,UnpackUnorm4x8CaseInstance *this)

{
  ostringstream *poVar1;
  ShaderExecutor *pSVar2;
  TestStatus *pTVar3;
  deUint32 dVar4;
  ostream *poVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputs;
  deUint32 u32_1;
  deUint32 u32_3;
  deUint32 u32_5;
  deUint32 u32_7;
  deUint32 u32;
  deUint32 u32_2;
  deUint32 u32_4;
  deUint32 u32_6;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> outputs;
  void *in;
  Random rnd;
  Hex<8UL> local_270;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_268;
  UnpackUnorm4x8CaseInstance *local_250;
  uint local_244;
  uint local_240;
  uint local_23c;
  long local_238;
  float local_22c;
  float local_228;
  float local_224;
  float local_220;
  float local_21c;
  float local_218;
  float local_214;
  float local_210;
  float local_20c;
  float local_208;
  float local_204;
  float local_200;
  float local_1fc;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_1f8;
  ulong local_1d8;
  TestStatus *local_1d0;
  ulong local_1c8;
  undefined1 local_1c0 [16];
  TestLog local_1b0 [13];
  ios_base local_148 [264];
  deRandom local_40;
  
  local_250 = this;
  dVar4 = deStringHash((this->super_ShaderPackingFunctionTestInstance).m_name);
  deRandom_init(&local_40,dVar4 ^ 0x776002);
  local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_1f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c0._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&local_268,(iterator)0x0,(uint *)local_1c0);
  local_1c0._0_4_ = 0x7fff8000;
  if (local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_268,
               (iterator)
               local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1c0);
  }
  else {
    *local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x7fff8000;
    local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1c0._0_4_ = 0x80007fff;
  if (local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_268,
               (iterator)
               local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1c0);
  }
  else {
    *local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x80007fff;
    local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1c0._0_4_ = 0xffffffff;
  if (local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_268,
               (iterator)
               local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1c0);
  }
  else {
    *local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0xffffffff;
    local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1c0._0_4_ = 0x1fffe;
  local_1d0 = __return_storage_ptr__;
  if (local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_268,
               (iterator)
               local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1c0);
  }
  else {
    *local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x1fffe;
    local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  iVar9 = 0x5f;
  do {
    dVar4 = deRandom_getUint32(&local_40);
    local_1c0._0_4_ = dVar4;
    if (local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_268,
                 (iterator)
                 local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)local_1c0);
    }
    else {
      *local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = dVar4;
      local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&local_1f8,
             (long)local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start >> 2);
  local_1c0._0_8_ = ((local_250->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1c0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Executing shader for ",0x15)
  ;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_148);
  local_1c0._0_8_ =
       local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_270.value =
       (deUint64)
       local_1f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (local_250->super_ShaderPackingFunctionTestInstance).m_executor.
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar2->_vptr_ShaderExecutor[2])
            (pSVar2,(ulong)((long)local_268.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_268.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2,local_1c0,&local_270
             ,0);
  local_1d8 = (ulong)((long)local_268.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2;
  uVar10 = 0;
  if (0 < (int)local_1d8) {
    lVar7 = 0;
    lVar8 = 0xc;
    uVar10 = 0;
    do {
      uVar11 = *(uint *)((long)(qpTestLog **)
                               local_268.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar7 * 4);
      fVar12 = (float)(uVar11 >> 0x18) / 255.0;
      local_208 = 1.0;
      if (fVar12 <= 1.0) {
        local_208 = fVar12;
      }
      local_218 = *(float *)((long)(local_1f8.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar8);
      local_244 = (int)local_218 - (int)local_208;
      if ((uint)local_218 < (uint)local_208) {
        local_244 = -((int)local_218 - (int)local_208);
      }
      fVar13 = (float)(uVar11 >> 0x10 & 0xff) / 255.0;
      fVar12 = 1.0;
      if (fVar13 <= 1.0) {
        fVar12 = fVar13;
      }
      local_214 = *(float *)((long)(local_1f8.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar8 + -4)
      ;
      local_240 = (int)local_214 - (int)fVar12;
      if ((uint)local_214 < (uint)fVar12) {
        local_240 = -((int)local_214 - (int)fVar12);
      }
      fVar14 = (float)(uVar11 >> 8 & 0xff) / 255.0;
      fVar13 = 1.0;
      if (fVar14 <= 1.0) {
        fVar13 = fVar14;
      }
      local_20c = *(float *)((long)(local_1f8.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_data +
                            lVar8 + -0xc);
      local_210 = *(float *)((long)(local_1f8.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar8 + -8)
      ;
      local_23c = (int)local_210 - (int)fVar13;
      if ((uint)local_210 < (uint)fVar13) {
        local_23c = -((int)local_210 - (int)fVar13);
      }
      fVar15 = (float)(uVar11 & 0xff) / 255.0;
      fVar14 = 1.0;
      if (fVar15 <= 1.0) {
        fVar14 = fVar15;
      }
      uVar11 = (int)local_20c - (int)fVar14;
      if ((uint)local_20c < (uint)fVar14) {
        uVar11 = -((int)local_20c - (int)fVar14);
      }
      local_238 = lVar7;
      local_204 = fVar12;
      local_200 = fVar13;
      local_1fc = fVar14;
      if (((1 < uVar11) || (1 < local_23c)) || (1 < (local_240 | local_244))) {
        if ((int)uVar10 < 10) {
          local_1c0._0_8_ = ((local_250->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1c0 + 8);
          local_22c = local_218;
          local_228 = local_214;
          local_224 = local_210;
          local_220 = local_20c;
          local_21c = local_208;
          local_1c8 = uVar10;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<(poVar1,(int)local_238);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"  expected unpackUnorm4x8(",0x1a);
          local_270.value =
               (deUint64)
               *(uint *)((long)(qpTestLog **)
                               local_268.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + local_238 * 4);
          tcu::Format::Hex<8UL>::toStream(&local_270,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") = ",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"vec4(",5);
          poVar5 = std::ostream::_M_insert<double>((double)local_1fc);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
          local_270.value = (deUint64)(uint)fVar14;
          tcu::Format::Hex<8UL>::toStream(&local_270,poVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1c0 + 8),", ",2);
          poVar5 = (ostream *)(local_1c0 + 8);
          poVar6 = std::ostream::_M_insert<double>((double)local_200);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_270.value = (deUint64)(uint)fVar13;
          tcu::Format::Hex<8UL>::toStream(&local_270,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          poVar6 = std::ostream::_M_insert<double>((double)local_204);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_270.value = (deUint64)(uint)fVar12;
          tcu::Format::Hex<8UL>::toStream(&local_270,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          poVar6 = std::ostream::_M_insert<double>((double)local_208);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_270.value = (deUint64)(uint)local_21c;
          tcu::Format::Hex<8UL>::toStream(&local_270,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", got vec4(",0xb);
          poVar6 = std::ostream::_M_insert<double>((double)local_20c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_270.value = (deUint64)(uint)local_220;
          tcu::Format::Hex<8UL>::toStream(&local_270,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          poVar6 = std::ostream::_M_insert<double>((double)local_210);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_270.value = (deUint64)(uint)local_224;
          tcu::Format::Hex<8UL>::toStream(&local_270,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          poVar6 = std::ostream::_M_insert<double>((double)local_214);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_270.value = (deUint64)(uint)local_228;
          tcu::Format::Hex<8UL>::toStream(&local_270,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          poVar6 = std::ostream::_M_insert<double>((double)local_218);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_270.value = (deUint64)(uint)local_22c;
          tcu::Format::Hex<8UL>::toStream(&local_270,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n  ULP diffs = (",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"), max diff = ",0xe);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar5);
          std::ios_base::~ios_base(local_148);
          uVar10 = local_1c8;
        }
        else if ((int)uVar10 == 10) {
          local_1c0._0_8_ = ((local_250->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1c0 + 8),"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1c0 + 8));
          std::ios_base::~ios_base(local_148);
        }
        uVar10 = (ulong)((int)uVar10 + 1);
      }
      lVar7 = local_238 + 1;
      lVar8 = lVar8 + 0x10;
    } while (lVar7 < (int)((ulong)((long)local_268.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_268.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  local_1c0._0_8_ = ((local_250->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1c0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::operator<<(poVar1,(int)local_1d8 - (int)uVar10);
  pTVar3 = local_1d0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
  std::ostream::operator<<(poVar1,(int)local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_148);
  local_1c0._0_8_ = local_1b0;
  if ((int)uVar10 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"Pass","");
    pTVar3->m_code = QP_TEST_RESULT_PASS;
    (pTVar3->m_description)._M_dataplus._M_p = (pointer)&(pTVar3->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar3->m_description,local_1c0._0_8_,
               (long)(qpTestLog **)local_1c0._0_8_ + local_1c0._8_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c0,"Result comparison failed","");
    pTVar3->m_code = QP_TEST_RESULT_FAIL;
    (pTVar3->m_description)._M_dataplus._M_p = (pointer)&(pTVar3->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar3->m_description,local_1c0._0_8_,
               (long)(qpTestLog **)local_1c0._0_8_ + local_1c0._8_8_);
  }
  if ((TestLog *)local_1c0._0_8_ != local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)((long)&(local_1b0[0].m_log)->flags + 1));
  }
  if (local_1f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((TestLog *)
      local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (TestLog *)0x0) {
    operator_delete(local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar3;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const deUint32				maxDiff		= 1; // Rounding error.
		de::Random					rnd			(deStringHash(m_name) ^ 0x776002);
		std::vector<deUint32>		inputs;
		std::vector<tcu::Vec4>		outputs;

		inputs.push_back(0x00000000u);
		inputs.push_back(0x7fff8000u);
		inputs.push_back(0x80007fffu);
		inputs.push_back(0xffffffffu);
		inputs.push_back(0x0001fffeu);

		// Random values.
		for (int ndx = 0; ndx < 95; ndx++)
			inputs.push_back(rnd.getUint32());

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint8	in0		= (deUint8)(inputs[valNdx] & 0xff);
				const deUint8	in1		= (deUint8)((inputs[valNdx] >> 8) & 0xff);
				const deUint8	in2		= (deUint8)((inputs[valNdx] >> 16) & 0xff);
				const deUint8	in3		= (deUint8)(inputs[valNdx] >> 24);
				const float		ref0	= de::clamp(float(in0) / 255.f, 0.0f, 1.0f);
				const float		ref1	= de::clamp(float(in1) / 255.f, 0.0f, 1.0f);
				const float		ref2	= de::clamp(float(in2) / 255.f, 0.0f, 1.0f);
				const float		ref3	= de::clamp(float(in3) / 255.f, 0.0f, 1.0f);
				const float		res0	= outputs[valNdx].x();
				const float		res1	= outputs[valNdx].y();
				const float		res2	= outputs[valNdx].z();
				const float		res3	= outputs[valNdx].w();

				const deUint32	diff0	= getUlpDiff(ref0, res0);
				const deUint32	diff1	= getUlpDiff(ref1, res1);
				const deUint32	diff2	= getUlpDiff(ref2, res2);
				const deUint32	diff3	= getUlpDiff(ref3, res3);

				if (diff0 > maxDiff || diff1 > maxDiff || diff2 > maxDiff || diff3 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx << ",\n"
															   << "  expected unpackUnorm4x8(" << tcu::toHex(inputs[valNdx]) << ") = "
															   << "vec4(" << HexFloat(ref0) << ", " << HexFloat(ref1) << ", " << HexFloat(ref2) << ", " << HexFloat(ref3) << ")"
															   << ", got vec4(" << HexFloat(res0) << ", " << HexFloat(res1) << ", " << HexFloat(res2) << ", " << HexFloat(res3) << ")"
															   << "\n  ULP diffs = (" << diff0 << ", " << diff1 << ", " << diff2 << ", " << diff3 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			if (numFailed == 0)
				return tcu::TestStatus::pass("Pass");
			else
				return tcu::TestStatus::fail("Result comparison failed");

		}
	}